

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestStart(StreamingListener *this,TestInfo *test_info)

{
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,"event=TestStart&name=",&local_59);
  std::operator+(&local_58,&local_38,(test_info->name_)._M_dataplus._M_p);
  SendLn(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void OnTestStart(const TestInfo& test_info) {
    SendLn(std::string("event=TestStart&name=") + test_info.name());
  }